

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O1

void node__put(EditLine *el,keymacro_node_t *ptr)

{
  int iVar1;
  
  if (el == (EditLine *)0x0) {
    return;
  }
  if ((EditLine *)el->el_outfile != (EditLine *)0x0) {
    node__put((EditLine *)el->el_outfile,ptr);
    el->el_outfile = (FILE_conflict *)0x0;
  }
  node__put((EditLine *)el->el_errfile,ptr);
  iVar1 = *(int *)((long)&el->el_prog + 4);
  if ((iVar1 != 0) && (iVar1 != 2)) {
    if (iVar1 != 1) {
      abort();
    }
    if (el->el_infile != (FILE_conflict *)0x0) {
      free(el->el_infile);
    }
  }
  free(el);
  return;
}

Assistant:

static void
node__put(EditLine *el, keymacro_node_t *ptr)
{
	if (ptr == NULL)
		return;

	if (ptr->next != NULL) {
		node__put(el, ptr->next);
		ptr->next = NULL;
	}
	node__put(el, ptr->sibling);

	switch (ptr->type) {
	case XK_CMD:
	case XK_NOD:
		break;
	case XK_STR:
		if (ptr->val.str != NULL)
			el_free(ptr->val.str);
		break;
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ptr->type));
		break;
	}
	el_free(ptr);
}